

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t pmevcntr_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint8_t counter)

{
  uint32_t uVar1;
  uint64_t ret;
  uint8_t counter_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = pmu_num_counters(env);
  if (counter < uVar1) {
    pmevcntr_op_start(env,counter);
    env_local = (CPUARMState_conflict *)(env->cp15).c14_pmevcntr[counter];
    pmevcntr_op_finish(env,counter);
  }
  else {
    env_local = (CPUARMState_conflict *)0x0;
  }
  return (uint64_t)env_local;
}

Assistant:

static uint64_t pmevcntr_read(CPUARMState *env, const ARMCPRegInfo *ri,
                              uint8_t counter)
{
    if (counter < pmu_num_counters(env)) {
        uint64_t ret;
        pmevcntr_op_start(env, counter);
        ret = env->cp15.c14_pmevcntr[counter];
        pmevcntr_op_finish(env, counter);
        return ret;
    } else {
      /* We opt to behave as a RAZ/WI when attempts to access PM[X]EVCNTR
       * are CONSTRAINED UNPREDICTABLE. */
        return 0;
    }
}